

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker3F1S.cpp
# Opt level: O0

void __thiscall WorkerCallback::WorkerCallback(WorkerCallback *this,string *output)

{
  bool bVar1;
  char *__filename;
  FILE *pFVar2;
  string *output_local;
  WorkerCallback *this_local;
  
  Callback::Callback(&this->super_Callback);
  (this->super_Callback)._vptr_Callback = (_func_int **)&PTR_on_start_0011bca8;
  bVar1 = std::operator==(output,"stdout");
  if (bVar1) {
    this->m_output = _stdout;
  }
  else {
    bVar1 = std::operator==(output,"null");
    if (bVar1) {
      this->m_output = (FILE *)0x0;
    }
    else {
      __filename = (char *)std::__cxx11::string::c_str();
      pFVar2 = fopen(__filename,"w");
      this->m_output = (FILE *)pFVar2;
    }
  }
  return;
}

Assistant:

WorkerCallback(std::string output)
    {
        if (output == "stdout") {
            m_output = stdout;
        } else if (output == "null") {
            m_output = NULL;
        } else {
            m_output = fopen(output.c_str(), "w");
        }
    }